

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

bool __thiscall leveldb::MemTable::Get(MemTable *this,LookupKey *key,string *value,Status *s)

{
  char *pcVar1;
  int iVar2;
  Node *pNVar3;
  bool bVar4;
  char *pcVar5;
  uint32_t key_length;
  uint local_5c;
  Slice local_58;
  Status local_48;
  Slice local_40;
  
  local_58.data_ = key->start_;
  pNVar3 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
                     (&this->table_,&local_58.data_,(Node **)0x0);
  if (pNVar3 == (Node *)0x0) {
    return false;
  }
  pcVar1 = pNVar3->key;
  if (*pcVar1 < '\0') {
    pcVar5 = GetVarint32PtrFallback(pcVar1,pcVar1 + 5,&local_5c);
  }
  else {
    pcVar5 = pcVar1 + 1;
    local_5c = (int)*pcVar1;
  }
  local_58.size_ = (size_t)(local_5c - 8);
  local_40.data_ = key->kstart_;
  local_40.size_ = (size_t)(key->end_ + (-8 - (long)local_40.data_));
  local_58.data_ = pcVar5;
  iVar2 = (*((this->comparator_).comparator.user_comparator_)->_vptr_Comparator[2])();
  if (iVar2 == 0) {
    if (pcVar5[(ulong)local_5c - 8] == '\0') {
      local_58.data_ = "";
      local_58.size_ = 0;
      local_40.data_ = "";
      local_40.size_ = 0;
      Status::Status(&local_48,kNotFound,&local_58,&local_40);
      pcVar1 = s->state_;
      s->state_ = (char *)local_48;
      if (pcVar1 != (char *)0x0) {
        local_48.state_ = pcVar1;
        operator_delete__(pcVar1);
      }
    }
    else {
      if (pcVar5[(ulong)local_5c - 8] != '\x01') goto LAB_0010cc36;
      if (value != (string *)0x0) {
        pcVar5 = pcVar5 + local_5c;
        if (*pcVar5 < '\0') {
          pcVar5 = GetVarint32PtrFallback(pcVar5,pcVar5 + 5,(uint32_t *)&local_58);
        }
        else {
          pcVar5 = pcVar5 + 1;
        }
        std::__cxx11::string::_M_replace
                  ((ulong)value,0,(char *)value->_M_string_length,(ulong)pcVar5);
      }
    }
    bVar4 = true;
  }
  else {
LAB_0010cc36:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool MemTable::Get(const LookupKey& key, std::string* value, Status* s) {
  Slice memkey = key.memtable_key();
  Table::Iterator iter(&table_);
  iter.Seek(memkey.data());
  if (iter.Valid()) {
    // entry format is:
    //    klength  varint32
    //    userkey  char[klength]
    //    tag      uint64
    //    vlength  varint32
    //    value    char[vlength]
    // Check that it belongs to same user key.  We do not check the
    // sequence number since the Seek() call above should have skipped
    // all entries with overly large sequence numbers.
    const char* entry = iter.key();
    uint32_t key_length;
    const char* key_ptr = GetVarint32Ptr(entry, entry + 5, &key_length);
    if (comparator_.comparator.user_comparator()->Compare(
            Slice(key_ptr, key_length - 8), key.user_key()) == 0) {
      // Correct user key
      const uint64_t tag = DecodeFixed64(key_ptr + key_length - 8);
      switch (static_cast<ValueType>(tag & 0xff)) {
        case kTypeValue: {
          if(value != nullptr) {
            Slice v = GetLengthPrefixedSlice(key_ptr + key_length);
            value->assign(v.data(), v.size());            
          }
          return true;
        }
        case kTypeDeletion:
          *s = Status::NotFound(Slice());
          return true;
      }
    }
  }
  return false;
}